

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::EncodeSymbol
          (MeshEdgebreakerTraversalValenceEncoder *this,EdgebreakerTopologyBitPattern symbol)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer piVar1;
  MeshEdgebreakerEncoderImplInterface *pMVar2;
  pointer piVar3;
  iterator __position;
  iterator __position_00;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  pointer pIVar7;
  pointer pIVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint local_40;
  int local_3c;
  ulong local_38;
  
  this->num_symbols_ = this->num_symbols_ + 1;
  uVar9 = (this->last_corner_).value_;
  uVar6 = (ulong)uVar9;
  uVar5 = uVar9;
  if (uVar6 != 0xffffffff) {
    uVar5 = uVar9 - 2;
    if (0x55555555 < (uVar9 + 1) * -0x55555555) {
      uVar5 = uVar9 + 1;
    }
  }
  if (uVar9 == 0xffffffff) {
    uVar9 = 0xffffffff;
  }
  else {
    uVar9 = ((uVar9 * -0x55555555 < 0x55555556) - 1 | 2) + uVar9;
  }
  pIVar8 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar1 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = piVar1[pIVar8[uVar5].value_];
  switch(symbol) {
  case TOPOLOGY_C:
  case TOPOLOGY_S:
    piVar1[pIVar8[uVar5].value_] = uVar11 - 1;
    piVar1[pIVar8[uVar9].value_] = piVar1[pIVar8[uVar9].value_] + -1;
    if (symbol == TOPOLOGY_S) {
      if (uVar9 != 0xffffffff) {
        uVar9 = (this->corner_table_->opposite_corners_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar9].value_;
      }
      local_38 = (ulong)uVar11;
      if (uVar9 == 0xffffffff) {
        iVar10 = 1;
      }
      else {
        iVar10 = 0;
        do {
          pMVar2 = (this->super_MeshEdgebreakerTraversalEncoder).encoder_impl_;
          iVar4 = (*pMVar2->_vptr_MeshEdgebreakerEncoderImplInterface[9])(pMVar2,(ulong)uVar9 / 3);
          if ((char)iVar4 != '\0') break;
          uVar11 = uVar9 + 1;
          uVar9 = uVar9 - 2;
          if (0x55555555 < uVar11 * -0x55555555) {
            uVar9 = uVar11;
          }
          if (uVar9 != 0xffffffff) {
            uVar9 = (this->corner_table_->opposite_corners_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar9].value_;
          }
          iVar10 = iVar10 + 1;
        } while (uVar9 != 0xffffffff);
        iVar10 = iVar10 + 1;
      }
      pIVar8 = (this->corner_to_vertex_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar1 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pIVar7 = (pointer)(ulong)pIVar8[(this->last_corner_).value_].value_;
      piVar1[(long)pIVar7] = iVar10;
      if (uVar5 != 0xffffffff) {
        pIVar7 = (this->corner_table_->opposite_corners_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = pIVar7[uVar5].value_;
      }
      if (uVar5 == 0xffffffff) {
        local_3c = 1;
      }
      else {
        piVar3 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        iVar10 = 0;
        do {
          pMVar2 = (this->super_MeshEdgebreakerTraversalEncoder).encoder_impl_;
          iVar4 = (*pMVar2->_vptr_MeshEdgebreakerEncoderImplInterface[9])
                            (pMVar2,(ulong)uVar5 / 3,pIVar8,pIVar7);
          if ((char)iVar4 != '\0') break;
          uVar9 = uVar5 - 2;
          if (0x55555555 < (uVar5 + 1) * -0x55555555) {
            uVar9 = uVar5 + 1;
          }
          pIVar8 = (this->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pIVar7 = (pointer)(ulong)-(uVar5 % 3);
          pIVar8[uVar9].value_ = (uint)((ulong)((long)piVar3 - (long)piVar1) >> 2);
          uVar5 = (-(uint)(uVar5 % 3 != 0) | 2) + uVar5;
          if (uVar5 != 0xffffffff) {
            pIVar7 = (this->corner_table_->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = pIVar7[uVar5].value_;
          }
          iVar10 = iVar10 + 1;
        } while (uVar5 != 0xffffffff);
        local_3c = iVar10 + 1;
      }
      __position._M_current =
           (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar11 = (uint)local_38;
      if (__position._M_current ==
          (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&(this->vertex_valences_).vector_,__position,&local_3c);
      }
      else {
        *__position._M_current = local_3c;
        (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    break;
  case TOPOLOGY_L:
    piVar1[pIVar8[uVar6].value_] = piVar1[pIVar8[uVar6].value_] + -1;
    piVar1[pIVar8[uVar5].value_] = piVar1[pIVar8[uVar5].value_] + -2;
    piVar1[pIVar8[uVar9].value_] = piVar1[pIVar8[uVar9].value_] + -1;
    break;
  case TOPOLOGY_R:
    piVar1[pIVar8[uVar6].value_] = piVar1[pIVar8[uVar6].value_] + -1;
    piVar1[pIVar8[uVar5].value_] = piVar1[pIVar8[uVar5].value_] + -1;
    goto LAB_00142982;
  case TOPOLOGY_E:
    piVar1[pIVar8[uVar6].value_] = piVar1[pIVar8[uVar6].value_] + -2;
    piVar1[pIVar8[uVar5].value_] = piVar1[pIVar8[uVar5].value_] + -2;
LAB_00142982:
    piVar1[pIVar8[uVar9].value_] = piVar1[pIVar8[uVar9].value_] + -2;
  }
  if ((long)this->prev_symbol_ != -1) {
    uVar9 = this->max_valence_;
    if ((int)uVar11 < this->max_valence_) {
      uVar9 = uVar11;
    }
    iVar10 = 0;
    if (this->min_valence_ <= (int)uVar11) {
      iVar10 = uVar9 - this->min_valence_;
    }
    this_00 = (this->context_symbols_).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + iVar10;
    local_40 = *(uint *)(edge_breaker_topology_to_symbol_id + (long)this->prev_symbol_ * 4);
    __position_00._M_current =
         (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,__position_00,&local_40);
    }
    else {
      *__position_00._M_current = local_40;
      (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
  }
  this->prev_symbol_ = symbol;
  return;
}

Assistant:

inline void EncodeSymbol(EdgebreakerTopologyBitPattern symbol) {
    ++num_symbols_;
    // Update valences on the mesh and compute the context that is going to be
    // used to encode the processed symbol.
    // Note that the valences are computed for the so far unencoded part of the
    // mesh (i.e. the decoding is reverse). Adding a new symbol either reduces
    // valences on the vertices or leaves the valence unchanged.

    const CornerIndex next = corner_table_->Next(last_corner_);
    const CornerIndex prev = corner_table_->Previous(last_corner_);

    // Get valence on the tip corner of the active edge (outgoing edge that is
    // going to be used in reverse decoding of the connectivity to predict the
    // next symbol).
    const int active_valence = vertex_valences_[corner_to_vertex_map_[next]];
    switch (symbol) {
      case TOPOLOGY_C:
        // Compute prediction.
        FALLTHROUGH_INTENDED;
      case TOPOLOGY_S:
        // Update valences.
        vertex_valences_[corner_to_vertex_map_[next]] -= 1;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 1;
        if (symbol == TOPOLOGY_S) {
          // Whenever we reach a split symbol, we need to split the vertex into
          // two and attach all corners on the left and right sides of the split
          // vertex to the respective vertices (see image below). This is
          // necessary since the decoder works in the reverse order and it
          // merges the two vertices only after the split symbol is processed.
          //
          //     * -----
          //    / \--------
          //   /   \--------
          //  /     \-------
          // *-------v-------*
          //  \     /c\     /
          //   \   /   \   /
          //    \ /n S p\ /
          //     *.......*
          //

          // Count the number of faces on the left side of the split vertex and
          // update the valence on the "left vertex".
          int num_left_faces = 0;
          CornerIndex act_c = corner_table_->Opposite(prev);
          while (act_c != kInvalidCornerIndex) {
            if (encoder_impl()->IsFaceEncoded(corner_table_->Face(act_c))) {
              break;  // Stop when we reach the first visited face.
            }
            ++num_left_faces;
            act_c = corner_table_->Opposite(corner_table_->Next(act_c));
          }
          vertex_valences_[corner_to_vertex_map_[last_corner_]] =
              num_left_faces + 1;

          // Create a new vertex for the right side and count the number of
          // faces that should be attached to this vertex.
          const int new_vert_id = static_cast<int>(vertex_valences_.size());
          int num_right_faces = 0;

          act_c = corner_table_->Opposite(next);
          while (act_c != kInvalidCornerIndex) {
            if (encoder_impl()->IsFaceEncoded(corner_table_->Face(act_c))) {
              break;  // Stop when we reach the first visited face.
            }
            ++num_right_faces;
            // Map corners on the right side to the newly created vertex.
            corner_to_vertex_map_[corner_table_->Next(act_c)] = new_vert_id;
            act_c = corner_table_->Opposite(corner_table_->Previous(act_c));
          }
          vertex_valences_.push_back(num_right_faces + 1);
        }
        break;
      case TOPOLOGY_R:
        // Update valences.
        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 1;
        vertex_valences_[corner_to_vertex_map_[next]] -= 1;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 2;
        break;
      case TOPOLOGY_L:

        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 1;
        vertex_valences_[corner_to_vertex_map_[next]] -= 2;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 2;
        vertex_valences_[corner_to_vertex_map_[next]] -= 2;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 2;
        break;
      default:
        break;
    }

    if (prev_symbol_ != -1) {
      int clamped_valence;
      if (active_valence < min_valence_) {
        clamped_valence = min_valence_;
      } else if (active_valence > max_valence_) {
        clamped_valence = max_valence_;
      } else {
        clamped_valence = active_valence;
      }

      const int context = clamped_valence - min_valence_;
      context_symbols_[context].push_back(
          edge_breaker_topology_to_symbol_id[prev_symbol_]);
    }

    prev_symbol_ = symbol;
  }